

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O0

RGBA tcu::anon_unknown_0::bilinearSampleRGBA8(ConstPixelBufferAccess *access,deUint32 u,deUint32 v)

{
  deUint8 dVar1;
  deUint8 dVar2;
  deUint8 dVar3;
  deUint8 dVar4;
  deUint8 dVar5;
  deUint8 dVar6;
  deUint8 p11_00;
  uint x;
  uint y;
  deUint32 fx1_00;
  deUint32 fy1_00;
  deUint32 color;
  deUint32 color_00;
  deUint32 color_01;
  deUint32 color_02;
  deUint32 res;
  deUint32 p11;
  deUint32 p01;
  deUint32 p10;
  deUint32 p00;
  deUint32 fy1;
  deUint32 fx1;
  deUint32 y1;
  deUint32 x1;
  deUint32 y0;
  deUint32 x0;
  deUint32 v_local;
  deUint32 u_local;
  ConstPixelBufferAccess *access_local;
  
  x = u >> 8;
  y = v >> 8;
  fx1_00 = u + x * -0x100;
  fy1_00 = v + y * -0x100;
  color = readRGBA8Raw(access,x,y);
  color_00 = readRGBA8Raw(access,x + 1,y);
  color_01 = readRGBA8Raw(access,x,y + 1);
  color_02 = readRGBA8Raw(access,x + 1,y + 1);
  dVar1 = getChannel<0>(color);
  dVar2 = getChannel<0>(color_01);
  dVar3 = getChannel<0>(color_00);
  dVar4 = getChannel<0>(color_02);
  dVar1 = interpolateChannel(fx1_00,fy1_00,dVar1,dVar2,dVar3,dVar4);
  dVar2 = getChannel<1>(color);
  dVar3 = getChannel<1>(color_01);
  dVar4 = getChannel<1>(color_00);
  dVar5 = getChannel<1>(color_02);
  dVar2 = interpolateChannel(fx1_00,fy1_00,dVar2,dVar3,dVar4,dVar5);
  dVar3 = getChannel<2>(color);
  dVar4 = getChannel<2>(color_01);
  dVar5 = getChannel<2>(color_00);
  dVar6 = getChannel<2>(color_02);
  dVar3 = interpolateChannel(fx1_00,fy1_00,dVar3,dVar4,dVar5,dVar6);
  dVar4 = getChannel<3>(color);
  dVar5 = getChannel<3>(color_01);
  dVar6 = getChannel<3>(color_00);
  p11_00 = getChannel<3>(color_02);
  dVar4 = interpolateChannel(fx1_00,fy1_00,dVar4,dVar5,dVar6,p11_00);
  RGBA::RGBA((RGBA *)((long)&access_local + 4),CONCAT13(dVar4,CONCAT12(dVar3,CONCAT11(dVar2,dVar1)))
            );
  return (RGBA)access_local._4_4_;
}

Assistant:

RGBA bilinearSampleRGBA8 (const ConstPixelBufferAccess& access, deUint32 u, deUint32 v)
{
	deUint32	x0		= u>>NUM_SUBPIXEL_BITS;
	deUint32	y0		= v>>NUM_SUBPIXEL_BITS;
	deUint32	x1		= x0+1; //de::min(x0+1, (deUint32)(access.getWidth()-1));
	deUint32	y1		= y0+1; //de::min(y0+1, (deUint32)(access.getHeight()-1));

	DE_ASSERT(x1 < (deUint32)access.getWidth());
	DE_ASSERT(y1 < (deUint32)access.getHeight());

	deUint32	fx1		= u-(x0<<NUM_SUBPIXEL_BITS);
	deUint32	fy1		= v-(y0<<NUM_SUBPIXEL_BITS);

	deUint32	p00		= readRGBA8Raw(access, x0, y0);
	deUint32	p10		= readRGBA8Raw(access, x1, y0);
	deUint32	p01		= readRGBA8Raw(access, x0, y1);
	deUint32	p11		= readRGBA8Raw(access, x1, y1);

	deUint32	res		= 0;

	res |= interpolateChannel(fx1, fy1, getChannel<0>(p00), getChannel<0>(p01), getChannel<0>(p10), getChannel<0>(p11)) << RGBA::RED_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<1>(p00), getChannel<1>(p01), getChannel<1>(p10), getChannel<1>(p11)) << RGBA::GREEN_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<2>(p00), getChannel<2>(p01), getChannel<2>(p10), getChannel<2>(p11)) << RGBA::BLUE_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<3>(p00), getChannel<3>(p01), getChannel<3>(p10), getChannel<3>(p11)) << RGBA::ALPHA_SHIFT;

	return RGBA(res);
}